

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

byte_vec_t * __thiscall sfc::Map::gbc_banked_data(byte_vec_t *__return_storage_ptr__,Map *this)

{
  uint uVar1;
  runtime_error *this_00;
  ulong uVar2;
  uint uVar3;
  allocator_type local_31;
  byte_vec_t linear_data;
  
  if (((this->_map_width & 0x1f) == 0) && ((this->_map_height & 0x1f) == 0)) {
    uVar2 = 0;
    native_data(&linear_data,this,false,0,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,
               (long)linear_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)linear_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,&local_31);
    uVar1 = 0;
    while( true ) {
      if ((ulong)((long)linear_data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)linear_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 1 <= (ulong)uVar1) break;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[uVar1] =
           linear_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar2];
      uVar1 = uVar1 + 1;
      uVar2 = (ulong)((int)uVar2 + 2);
    }
    uVar3 = 0;
    uVar1 = 1;
    while( true ) {
      uVar2 = (ulong)((long)linear_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)linear_data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 1;
      if (uVar2 <= uVar3) break;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[uVar3 + uVar2] =
           linear_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar1];
      uVar3 = uVar3 + 1;
      uVar1 = uVar1 + 2;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&linear_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"gbc/out-gbc-bank requires map dimensions to be multiples of 32");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

byte_vec_t Map::gbc_banked_data() const {
  if ((width() % 32) || (height() % 32))
    throw std::runtime_error("gbc/out-gbc-bank requires map dimensions to be multiples of 32");

  const auto linear_data = native_data();
  auto banked_data = byte_vec_t(linear_data.size());
  for (unsigned i = 0; i < linear_data.size() >> 1; ++i) banked_data[i] = linear_data[i << 1];
  for (unsigned i = 0; i < linear_data.size() >> 1; ++i) banked_data[i + (linear_data.size() >> 1)] = linear_data[(i << 1) + 1];
  return banked_data;
}